

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_png_file(ConstPtr *image,string *filename,int compression_level)

{
  long lVar1;
  long lVar2;
  string *filename_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  invalid_argument *this;
  char *pcVar6;
  FileException *this_00;
  int *piVar7;
  Exception *pEVar8;
  ImageBase *pIVar9;
  TypedImageBase<unsigned_char> *this_01;
  ImageData *this_02;
  const_reference pvVar10;
  reference ppuVar11;
  int local_e4;
  int png_transforms;
  int i;
  ImageData *data;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> row_pointers;
  string local_b8 [32];
  undefined4 local_98;
  undefined1 local_92;
  allocator local_91;
  int color_type;
  long local_70;
  png_infop info_ptr;
  string local_60 [32];
  long local_40;
  png_structp png_ptr;
  FILE *fp;
  int local_1c;
  string *psStack_18;
  int compression_level_local;
  string *filename_local;
  ConstPtr *image_local;
  
  local_1c = compression_level;
  psStack_18 = filename;
  filename_local = (string *)image;
  bVar3 = std::operator==(image,(nullptr_t)0x0);
  if (bVar3) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  png_ptr = (png_structp)fopen(pcVar6,"wb");
  if ((FILE *)png_ptr == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    filename_00 = psStack_18;
    piVar7 = __errno_location();
    pcVar6 = strerror(*piVar7);
    util::FileException::FileException(this_00,filename_00,pcVar6);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  local_40 = png_create_write_struct("1.6.37",0,0);
  if (local_40 == 0) {
    fclose((FILE *)png_ptr);
    info_ptr._6_1_ = 1;
    pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Out of memory",(allocator *)((long)&info_ptr + 7));
    util::Exception::Exception(pEVar8,(string *)local_60);
    info_ptr._6_1_ = 0;
    __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  local_70 = png_create_info_struct(local_40);
  if (local_70 != 0) {
    png_init_io(local_40,png_ptr);
    pIVar9 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar4 = ImageBase::channels(pIVar9);
    switch(iVar4) {
    case 1:
      local_98 = 0;
      break;
    case 2:
      local_98 = 4;
      break;
    case 3:
      local_98 = 2;
      break;
    case 4:
      local_98 = 6;
      break;
    default:
      png_destroy_write_struct(&local_40,&local_70);
      fclose((FILE *)png_ptr);
      row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,"Cannot determine image color type",
                 (allocator *)
                 ((long)&row_pointers.
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      util::Exception::Exception(pEVar8,(string *)local_b8);
      row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    png_set_compression_level(local_40,local_1c);
    lVar2 = local_40;
    lVar1 = local_70;
    pIVar9 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar4 = ImageBase::width(pIVar9);
    pIVar9 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar5 = ImageBase::height(pIVar9);
    png_set_IHDR(lVar2,lVar1,iVar4,iVar5,8,local_98,0,0,0);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&data);
    pIVar9 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar4 = ImageBase::height(pIVar9);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::resize
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&data,(long)iVar4);
    this_01 = &std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<unsigned_char>;
    this_02 = TypedImageBase<unsigned_char>::get_data(this_01);
    local_e4 = 0;
    while( true ) {
      pIVar9 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      iVar4 = ImageBase::height(pIVar9);
      lVar2 = local_40;
      lVar1 = local_70;
      if (iVar4 <= local_e4) break;
      pIVar9 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      iVar4 = ImageBase::width(pIVar9);
      pIVar9 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      iVar5 = ImageBase::channels(pIVar9);
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (this_02,(long)(local_e4 * iVar4 * iVar5));
      ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                           ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&data,
                            (long)local_e4);
      *ppuVar11 = pvVar10;
      local_e4 = local_e4 + 1;
    }
    ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                         ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&data,0);
    png_set_rows(lVar2,lVar1,ppuVar11);
    png_write_png(local_40,local_70,0,0);
    png_write_end(local_40,local_70);
    png_destroy_write_struct(&local_40,&local_70);
    fclose((FILE *)png_ptr);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&data);
    return;
  }
  png_destroy_write_struct(&local_40,0);
  fclose((FILE *)png_ptr);
  local_92 = 1;
  pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&color_type,"Out of memory",&local_91);
  util::Exception::Exception(pEVar8,(string *)&color_type);
  local_92 = 0;
  __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
save_png_file (ByteImage::ConstPtr image,
    std::string const& filename, int compression_level)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    FILE *fp = std::fopen(filename.c_str(), "wb");
    if (!fp)
        throw util::FileException(filename, std::strerror(errno));

    //png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING,
    //    (png_voidp)user_error_ptr, user_error_fn, user_warning_fn);
    png_structp png_ptr = png_create_write_struct
        (PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);

    if (!png_ptr)
    {
        std::fclose(fp);
        throw util::Exception("Out of memory");
    }

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr)
    {
        png_destroy_write_struct(&png_ptr, (png_infopp)nullptr);
        std::fclose(fp);
        throw util::Exception("Out of memory");
    }

    png_init_io(png_ptr, fp);

    // void write_row_callback(png_ptr, png_uint_32 row, int pass);
    //png_set_write_status_fn(png_ptr, write_row_callback);

    /* Determine color type to be written. */
    int color_type;
    switch (image->channels())
    {
        case 1: color_type = PNG_COLOR_TYPE_GRAY; break;
        case 2: color_type = PNG_COLOR_TYPE_GRAY_ALPHA; break;
        case 3: color_type = PNG_COLOR_TYPE_RGB; break;
        case 4: color_type = PNG_COLOR_TYPE_RGB_ALPHA; break;
        default:
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            std::fclose(fp);
            throw util::Exception("Cannot determine image color type");
        }
    }

    /* Set compression level (6 seems to be the default). */
    png_set_compression_level(png_ptr, compression_level);

    /* Write image. */
    png_set_IHDR(png_ptr, info_ptr, image->width(), image->height(),
        8 /* Bit depth */, color_type, PNG_INTERLACE_NONE,
        PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    /* Setup row pointers. */
    std::vector<png_bytep> row_pointers;
    row_pointers.resize(image->height());
    ByteImage::ImageData const& data = image->get_data();
    for (int i = 0; i < image->height(); ++i)
        row_pointers[i] = const_cast<png_bytep>(
            &data[i * image->width() * image->channels()]);

    /* Setup transformations. */
    int png_transforms = PNG_TRANSFORM_IDENTITY;
    //png_transforms |= PNG_TRANSFORM_INVERT_ALPHA;

    /* Write to file. */
    png_set_rows(png_ptr, info_ptr, &row_pointers[0]);
    png_write_png(png_ptr, info_ptr, png_transforms, nullptr);
    png_write_end(png_ptr, info_ptr);

    /* Cleanup. */
    png_destroy_write_struct(&png_ptr, &info_ptr);
    std::fclose(fp);
}